

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenLiteral * toBinaryenLiteral(BinaryenLiteral *__return_storage_ptr__,Literal x)

{
  Type *this;
  uint uVar1;
  bool bVar2;
  BasicType BVar3;
  int32_t iVar4;
  BasicHeapType BVar5;
  uintptr_t in_RAX;
  int64_t *piVar6;
  int64_t iVar7;
  ulong uVar8;
  Literal *in_RSI;
  char *pcVar9;
  Name NVar10;
  HeapType local_28;
  HeapType heapType;
  
  uVar8 = (in_RSI->type).id;
  __return_storage_ptr__->type = uVar8;
  local_28.id = in_RAX;
  if ((uVar8 < 2) || ((uVar8 & 1) != 0 && 6 < uVar8)) {
    pcVar9 = "x.type.isSingle()";
    uVar1 = 0x37;
    goto LAB_00d28b05;
  }
  this = &in_RSI->type;
  if (6 < uVar8) {
LAB_00d28a16:
    if ((uVar8 < 7) || ((uVar8 & 1) != 0)) {
      pcVar9 = "x.type.isRef()";
      uVar1 = 0x4e;
      goto LAB_00d28b05;
    }
    local_28 = wasm::Type::getHeapType(this);
    if (local_28.id < 0x7d) {
      BVar5 = wasm::HeapType::getBasic(&local_28,Unshared);
      switch(BVar5 << 0x1d | BVar5 - ext >> 3) {
      case 0:
        pcVar9 = "TODO: extern literals";
        uVar1 = 0x55;
        break;
      case 1:
      case 2:
      case 3:
      case 4:
      case 6:
      case 7:
      case ext:
        pcVar9 = "invalid type";
        uVar1 = 0x5d;
        break;
      case 5:
        pcVar9 = "TODO: i31";
        uVar1 = 0x53;
        break;
      case 9:
        pcVar9 = "TODO: string literals";
        uVar1 = 0x5f;
        break;
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
        return __return_storage_ptr__;
      default:
        goto switchD_00d28a60_default;
      }
    }
    else {
switchD_00d28a60_default:
      bVar2 = wasm::HeapType::isSignature(&local_28);
      if (bVar2) {
        NVar10 = wasm::Literal::getFunc(in_RSI);
        (__return_storage_ptr__->field_1).i64 = (int64_t)NVar10.super_IString.str._M_str;
        return __return_storage_ptr__;
      }
      bVar2 = wasm::Type::isData(this);
      if (!bVar2) {
        pcVar9 = "x.isData()";
        uVar1 = 0x6d;
LAB_00d28b05:
        __assert_fail(pcVar9,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                      ,uVar1,"BinaryenLiteral toBinaryenLiteral(Literal)");
      }
      pcVar9 = "TODO: gc data";
      uVar1 = 0x6e;
    }
LAB_00d28b51:
    wasm::handle_unreachable
              (pcVar9,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
               ,uVar1);
  }
  BVar3 = wasm::Type::getBasic(this);
  switch(BVar3) {
  case none:
  case unreachable:
    pcVar9 = "unexpected type";
    uVar1 = 0x4b;
    goto LAB_00d28b51;
  case i32:
    iVar4 = wasm::Literal::geti32(in_RSI);
    break;
  case i64:
    iVar7 = wasm::Literal::geti64(in_RSI);
    goto LAB_00d28a0d;
  case f32:
    iVar4 = wasm::Literal::reinterpreti32(in_RSI);
    break;
  case f64:
    iVar7 = wasm::Literal::reinterpreti64(in_RSI);
LAB_00d28a0d:
    (__return_storage_ptr__->field_1).i64 = iVar7;
    return __return_storage_ptr__;
  case v128:
    piVar6 = (int64_t *)wasm::Literal::getv128Ptr(in_RSI);
    iVar7 = piVar6[1];
    (__return_storage_ptr__->field_1).i64 = *piVar6;
    *(int64_t *)((long)&__return_storage_ptr__->field_1 + 8) = iVar7;
    return __return_storage_ptr__;
  default:
    uVar8 = this->id;
    goto LAB_00d28a16;
  }
  (__return_storage_ptr__->field_1).i32 = iVar4;
  return __return_storage_ptr__;
}

Assistant:

BinaryenLiteral toBinaryenLiteral(Literal x) {
  BinaryenLiteral ret;
  ret.type = x.type.getID();
  assert(x.type.isSingle());
  if (x.type.isBasic()) {
    switch (x.type.getBasic()) {
      case Type::i32:
        ret.i32 = x.geti32();
        return ret;
      case Type::i64:
        ret.i64 = x.geti64();
        return ret;
      case Type::f32:
        ret.i32 = x.reinterpreti32();
        return ret;
      case Type::f64:
        ret.i64 = x.reinterpreti64();
        return ret;
      case Type::v128:
        memcpy(&ret.v128, x.getv128Ptr(), 16);
        return ret;
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  assert(x.type.isRef());
  auto heapType = x.type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic(Unshared)) {
      case HeapType::i31:
        WASM_UNREACHABLE("TODO: i31");
      case HeapType::ext:
        WASM_UNREACHABLE("TODO: extern literals");
      case HeapType::any:
      case HeapType::eq:
      case HeapType::func:
      case HeapType::cont:
      case HeapType::struct_:
      case HeapType::array:
      case HeapType::exn:
        WASM_UNREACHABLE("invalid type");
      case HeapType::string:
        WASM_UNREACHABLE("TODO: string literals");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        // Null.
        return ret;
    }
  }
  if (heapType.isSignature()) {
    ret.func = x.getFunc().str.data();
    return ret;
  }
  assert(x.isData());
  WASM_UNREACHABLE("TODO: gc data");
}